

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O3

void __thiscall lsim::StringProperty::StringProperty(StringProperty *this,char *key,char *value)

{
  allocator local_1a;
  allocator local_19;
  
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__Property_001caa00;
  std::__cxx11::string::string((string *)&(this->super_Property).m_key,key,&local_19);
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__StringProperty_001ca7b0;
  std::__cxx11::string::string((string *)&this->m_value,value,&local_1a);
  return;
}

Assistant:

StringProperty::StringProperty(const char *key, const char *value) : 
    Property(key),
    m_value(value) {
}